

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O1

void __thiscall ChunkedStackPool<65532>::~ChunkedStackPool(ChunkedStackPool<65532> *this)

{
  StackChunk *pSVar1;
  StackChunk *pSVar2;
  
  pSVar2 = this->first;
  while (pSVar2 != (StackChunk *)0x0) {
    pSVar1 = pSVar2->next;
    (*(code *)NULLC::dealloc)(pSVar2);
    this->first = pSVar1;
    pSVar2 = pSVar1;
  }
  this->first = (StackChunk *)0x0;
  this->curr = (StackChunk *)0x0;
  this->size = 0xfffc;
  return;
}

Assistant:

~ChunkedStackPool()
	{
		Reset();
	}